

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

void voc_parse_np(voccxdef *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  unsigned_long uVar5;
  uchar *puVar6;
  uchar *puVar7;
  uchar *puVar8;
  uchar *puVar9;
  vocidef **in_RDI;
  bool bVar10;
  int lastidx;
  int firstidx;
  int j_1;
  uchar *sublstp;
  int j;
  uint len;
  int old_lastunk;
  int old_unknown;
  int i;
  char *p;
  uint lstsiz;
  uchar *lstp;
  int cur;
  int next;
  int no_match;
  int multi;
  int chkact;
  int complain;
  int *typarr;
  uint wordcharsiz;
  char *wordchararr;
  int wordcnt;
  char **wordarr;
  int cnt;
  uint typsiz;
  uchar *typp;
  uint wordsiz;
  uchar *wordp;
  uchar *save_sp;
  vocoldef *objlist;
  runcxdef *rcx;
  uint *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 uVar11;
  int in_stack_fffffffffffffef4;
  uint uVar12;
  undefined4 in_stack_fffffffffffffefc;
  voccxdef *ctx_00;
  uint lstsiz_00;
  undefined4 uVar13;
  undefined4 uVar14;
  vocidef *pvVar15;
  vocidef *pvVar16;
  int in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  int iVar17;
  undefined4 in_stack_ffffffffffffff3c;
  int iVar18;
  char **in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int local_a4;
  objucxdef *nounlist;
  int in_stack_ffffffffffffff68;
  vocidef *pvVar19;
  char *pcVar20;
  undefined1 local_80 [76];
  int local_34;
  vocidef *local_30;
  vocidef *local_28;
  vocidef **local_20;
  vocidef *local_18;
  vocidef **local_10;
  
  local_18 = in_RDI[2];
  local_28 = in_RDI[0x236];
  local_10 = in_RDI;
  local_20 = (vocidef **)
             voc_stk_alo((voccxdef *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         (uint)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  uVar1 = *(undefined4 *)((long)local_10 + 0x119c);
  uVar2 = *(undefined4 *)(local_10 + 0x234);
  *(undefined4 *)(local_10 + 0x234) = 0;
  *(undefined4 *)((long)local_10 + 0x119c) = 0;
  pvVar16 = *(vocidef **)(local_18 + 2);
  *(vocidef **)(local_18 + 2) = pvVar16 + -1;
  if (pvVar16[-1].vocinsc != '\a') {
    *(undefined4 *)(*(long *)*(vocidef **)local_18 + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
            (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  }
  pvVar16 = ((*(vocidef **)(local_18 + 2))->vociu).vociunxt;
  local_30 = pvVar16;
  local_34 = osrp2(pvVar16);
  local_34 = local_34 + -2;
  local_30 = (vocidef *)&local_30->field_0x2;
  pvVar15 = *(vocidef **)(local_18 + 2);
  *(vocidef **)(local_18 + 2) = pvVar15 + -1;
  if (pvVar15[-1].vocinsc != '\a') {
    *(undefined4 *)(*(long *)*(vocidef **)local_18 + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
            (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  }
  pvVar15 = ((*(vocidef **)(local_18 + 2))->vociu).vociunxt;
  local_80._64_8_ = pvVar15;
  local_80._60_4_ = osrp2(pvVar15);
  iVar17 = local_34;
  local_80._60_4_ = local_80._60_4_ + -2;
  local_80._64_8_ = local_80._64_8_ + 2;
  pvVar19 = *(vocidef **)(local_18 + 2);
  *(vocidef **)(local_18 + 2) = pvVar19 + -1;
  iVar18 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  if (pvVar19[-1].vocinsc != '\x01') {
    *(undefined4 *)(*(long *)*(vocidef **)local_18 + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),iVar18);
  }
  iVar3 = SUB84((*(vocidef **)(local_18 + 2))->vociu,0) + -1;
  pvVar19 = *(vocidef **)(local_18 + 2);
  *(vocidef **)(local_18 + 2) = pvVar19 + -1;
  if (pvVar19[-1].vocinsc == '\b') {
    uVar14 = 1;
  }
  else {
    if ((*(vocidef **)(local_18 + 2))->vocinsc != '\x05') {
      *(undefined4 *)(*(long *)*(vocidef **)local_18 + 0x68) = 0;
      runsign((runcxdef *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),iVar18);
    }
    uVar14 = 0;
  }
  pvVar19 = *(vocidef **)(local_18 + 2);
  *(vocidef **)(local_18 + 2) = pvVar19 + -1;
  local_80._12_4_ = uVar14;
  if (pvVar19[-1].vocinsc == '\b') {
    uVar13 = 1;
  }
  else {
    if ((*(vocidef **)(local_18 + 2))->vocinsc != '\x05') {
      *(undefined4 *)(*(long *)*(vocidef **)local_18 + 0x68) = 0;
      runsign((runcxdef *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),iVar18);
    }
    uVar13 = 0;
  }
  pvVar19 = *(vocidef **)(local_18 + 2);
  *(vocidef **)(local_18 + 2) = pvVar19 + -1;
  local_80._4_4_ = uVar13;
  if (pvVar19[-1].vocinsc == '\b') {
    lstsiz_00 = 1;
  }
  else {
    if ((*(vocidef **)(local_18 + 2))->vocinsc != '\x05') {
      *(undefined4 *)(*(long *)*(vocidef **)local_18 + 0x68) = 0;
      runsign((runcxdef *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),iVar18);
    }
    lstsiz_00 = 0;
  }
  local_80._44_4_ = 0;
  local_80._28_4_ = 0;
  pvVar19 = local_30;
  iVar18 = iVar3;
  local_80._8_4_ = lstsiz_00;
  while (iVar17 != 0) {
    local_80._44_4_ = local_80._44_4_ + 1;
    if (*(char *)pvVar19 == '\x03') {
      iVar4 = osrp2((char *)((long)pvVar19 + 1));
      local_80._28_4_ = iVar4 + 1 + local_80._28_4_;
    }
    lstadv((uchar **)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
           in_stack_fffffffffffffee8);
  }
  local_80._32_8_ =
       voc_stk_alo((voccxdef *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (uint)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  local_80._48_8_ =
       voc_stk_alo((voccxdef *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (uint)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  local_80._16_8_ =
       voc_stk_alo((voccxdef *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (uint)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  iVar17 = local_34;
  local_a4 = 0;
  nounlist = (objucxdef *)local_80._32_8_;
  pvVar19 = local_30;
  while (uVar11 = local_80._60_4_, iVar17 != 0) {
    if (*(char *)pvVar19 == '\x03') {
      *(objucxdef **)((uchar *)(local_80._48_8_ + 0x10) + (long)local_a4 * 8 + -0x10) = nounlist;
      iVar4 = osrp2((char *)((long)pvVar19 + 1));
      memcpy(nounlist,(char *)((long)pvVar19 + 3),(ulong)(iVar4 - 2U));
      nounlist->objucxbuf[(ulong)(iVar4 - 2U) - 0x38] = '\0';
      nounlist = (objucxdef *)(nounlist->objucxbuf + ((ulong)(iVar4 - 1) - 0x38));
      local_a4 = local_a4 + 1;
    }
    lstadv((uchar **)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
           in_stack_fffffffffffffee8);
  }
  *(undefined8 *)((uchar *)(local_80._48_8_ + 0x10) + (long)local_a4 * 8 + -0x10) = 0;
  local_a4 = 0;
  pcVar20 = (char *)local_80._64_8_;
  while (uVar11 != 0 && local_a4 < (int)local_80._44_4_) {
    if (*pcVar20 == '\x01') {
      uVar5 = osrp4(pcVar20 + 1);
      *(int *)((long)(errcxdef **)local_80._16_8_ + (long)local_a4 * 4) = (int)uVar5;
      local_a4 = local_a4 + 1;
    }
    lstadv((uchar **)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
           in_stack_fffffffffffffee8);
  }
  ctx_00 = (voccxdef *)local_80;
  uVar11 = local_80._4_4_;
  uVar12 = local_80._8_4_;
  local_80._56_4_ =
       vocgobj((voccxdef *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff40,
               (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               in_stack_ffffffffffffff34,(int *)pvVar16,(int)((ulong)pvVar15 >> 0x20),
               (vocoldef *)nounlist,in_stack_ffffffffffffff68,(int)pcVar20,
               (int *)CONCAT44(iVar18,iVar3));
  *(undefined4 *)((long)local_10 + 0x119c) = uVar1;
  *(undefined4 *)(local_10 + 0x234) = uVar2;
  if ((int)local_80._56_4_ < 0) {
    runpnil((runcxdef *)CONCAT44(in_stack_fffffffffffffef4,uVar11));
  }
  else if (local_80._56_4_ == 0) {
    voc_push_numlist(ctx_00,(uint *)CONCAT44(in_stack_fffffffffffffefc,uVar12),
                     in_stack_fffffffffffffef4);
  }
  else {
    local_a4 = 0;
    iVar17 = local_a4;
    while (local_a4 = iVar17, iVar17 = local_a4, local_a4 < (int)local_80._56_4_) {
      while( true ) {
        bVar10 = false;
        if (iVar17 < (int)local_80._56_4_) {
          bVar10 = local_20[(long)iVar17 * 5 + 1] == local_20[(long)local_a4 * 5 + 1];
        }
        if (!bVar10) break;
        iVar17 = iVar17 + 1;
      }
    }
    puVar6 = voc_push_list_siz((voccxdef *)CONCAT44(uVar14,uVar13),lstsiz_00);
    puVar7 = puVar6 + 1;
    *puVar6 = '\x01';
    oswp4s(puVar7,(long)(iVar18 + 1));
    puVar7 = puVar7 + 4;
    local_a4 = 0;
    while (local_a4 < (int)local_80._56_4_) {
      iVar17 = -1;
      puVar6 = puVar7 + 1;
      *puVar7 = '\a';
      for (iVar18 = 0; iVar3 = -1, iVar18 < (int)local_80._44_4_; iVar18 = iVar18 + 1) {
        if (*(vocidef **)((uchar *)(local_80._48_8_ + 0x10) + (long)iVar18 * 8 + -0x10) ==
            local_20[(long)local_a4 * 5 + 1]) {
          iVar17 = iVar18;
        }
        iVar3 = iVar18;
        if (*(vocidef **)((uchar *)(local_80._48_8_ + 0x10) + (long)iVar18 * 8 + -0x10) ==
            local_20[(long)local_a4 * 5 + 2]) break;
      }
      puVar8 = puVar7 + 4;
      puVar7[3] = '\x01';
      oswp4s(puVar8,(long)(iVar17 + 1));
      puVar9 = puVar8 + 5;
      puVar8[4] = '\x01';
      oswp4s(puVar9,(long)(iVar3 + 1));
      iVar17 = local_a4;
      while( true ) {
        puVar7 = puVar9 + 4;
        bVar10 = false;
        if (iVar17 < (int)local_80._56_4_) {
          bVar10 = local_20[(long)iVar17 * 5 + 1] == local_20[(long)local_a4 * 5 + 1];
        }
        if (!bVar10) break;
        if (*(short *)(local_20 + (long)iVar17 * 5) == -1) {
          puVar8 = puVar9 + 5;
          *puVar7 = '\x05';
        }
        else {
          puVar9 = puVar9 + 5;
          *puVar7 = '\x02';
          oswp2(puVar9,(uint)*(ushort *)(local_20 + (long)iVar17 * 5));
          puVar8 = puVar9 + 2;
        }
        puVar9 = puVar8 + 1;
        *puVar8 = '\x01';
        oswp4s(puVar9,(long)*(int *)(local_20 + (long)local_a4 * 5 + 4));
        iVar17 = iVar17 + 1;
      }
      oswp2(puVar6,(int)puVar7 - (int)puVar6);
      local_a4 = iVar17;
    }
  }
  local_10[0x236] = local_28;
  return;
}

Assistant:

void voc_parse_np(voccxdef *ctx)
{
    runcxdef *rcx = ctx->voccxrun;
    vocoldef *objlist;
    uchar *save_sp;
    uchar *wordp;
    uint wordsiz;
    uchar *typp;
    uint typsiz;
    int cnt;
    char **wordarr;
    int wordcnt;
    char *wordchararr;
    uint wordcharsiz;
    int *typarr;
    int complain;
    int chkact;
    int multi;
    int no_match;
    int next;
    int cur;
    uchar *lstp;
    uint lstsiz;
    char *p;
    int i;
    int old_unknown, old_lastunk;

    /* allocate stack arrays */
    voc_enter(ctx, &save_sp);
    VOC_MAX_ARRAY(ctx, vocoldef, objlist);

    /* 
     *   Save the original context unknown values, since we don't want to
     *   affect the context information in this game-initiated call, then
     *   clear the unknown word count for the duration of the call.  
     */
    old_unknown = ctx->voccxunknown;
    old_lastunk = ctx->voccxlastunk;
    ctx->voccxunknown = ctx->voccxlastunk = 0;

    /* get the list of words, and read its length prefix */
    wordp = runpoplst(rcx);
    wordsiz = osrp2(wordp) - 2;
    wordp += 2;

    /* get the list of types, and read its length prefix */
    typp = runpoplst(rcx);
    typsiz = osrp2(typp) - 2;
    typp += 2;

    /* get the starting index (adjusting for zero-based indexing) */
    cur = runpopnum(rcx) - 1;
    next = cur;

    /* get the flag arguments */
    complain = runpoplog(rcx);
    multi = runpoplog(rcx);
    chkact = runpoplog(rcx);

    /* count the words in the word list */
    for (wordcnt = 0, lstp = wordp, wordcharsiz = 0, lstsiz = wordsiz ;
         lstsiz != 0 ; lstadv(&lstp, &lstsiz))
    {
        /* count the word */
        ++wordcnt;

        /* 
         *   count the space needed for the word - count the bytes of the
         *   string plus a null terminator 
         */
        if (*lstp == DAT_SSTRING)
            wordcharsiz += osrp2(lstp+1) + 1;
    }

    /* allocate space for the word arrays */
    VOC_STK_ARRAY(ctx, char,   wordchararr, wordcharsiz);
    VOC_STK_ARRAY(ctx, char *, wordarr,     wordcnt+1);
    VOC_STK_ARRAY(ctx, int,    typarr,      wordcnt+1);

    /* build the word array */
    for (i = 0, p = wordchararr, lstp = wordp, lstsiz = wordsiz ;
         lstsiz != 0 ; lstadv(&lstp, &lstsiz))
    {
        /* add the word to the word array */
        if (*lstp == DAT_SSTRING)
        {
            uint len;
            
            /* add this entry to the word array */
            wordarr[i] = p;

            /* copy the word to the character array and null-terminate it */
            len = osrp2(lstp + 1) - 2;
            memcpy(p, lstp + 3, len);
            p[len] = '\0';

            /* move the write pointer past this entry */
            p += len + 1;

            /* bump the index */
            ++i;
        }
    }

    /* store an empty last entry */
    wordarr[i] = 0;

    /* build the type array */
    for (i = 0, lstp = typp, lstsiz = typsiz ;
         lstsiz != 0 && i < wordcnt ; lstadv(&lstp, &lstsiz))
    {
        /* add this entry to the type array */
        if (*lstp == DAT_NUMBER)
        {
            /* set the entry */
            typarr[i] = (int)osrp4(lstp + 1);

            /* bump the index */
            ++i;
        }
    }

    /* parse the noun phrase */
    cnt = vocgobj(ctx, wordarr, typarr, cur, &next, complain, objlist,
                  multi, chkact, &no_match);

    /* restore context unknown values */
    ctx->voccxunknown = old_unknown;
    ctx->voccxlastunk = old_lastunk;

    /* check the return value */
    if (cnt < 0)
    {
        /* syntax error; return nil to indicate an error */
        runpnil(rcx);
    }
    else if (cnt == 0)
    {
        /* 
         *   No objects found.  Return a list consisting only of the next
         *   index.  If the next index is equal to the starting index,
         *   this will tell the caller that no noun phrase is
         *   syntactically present; otherwise, it will tell the caller
         *   that a noun phrase is present but there are no matching
         *   objects.
         *   
         *   Note that we must increment the returned element index to
         *   conform with the 1-based index values that the game function
         *   uses.  
         */
        ++next;
        voc_push_numlist(ctx, (uint *)&next, 1);
    }
    else
    {
        /*
         *   We found one or more objects.  Return a list whose first
         *   element is the index of the next word to be parsed, and whose
         *   remaining elements are sublists.  Each sublist contains a
         *   match for one noun phrase; for each AND adding another noun
         *   phrase, there's another sublist.  Each sublist contains the
         *   index of the first word of its noun phrase, the index of the
         *   last word of its noun phrase, and then the objects.  For each
         *   object, there is a pair of entries: the object itself, and
         *   the flags for the object.
         *   
         *   First, figure out how much space we need by scanning the
         *   return list.  
         */
        for (lstsiz = 0, i = 0 ; i < cnt ; )
        {
            int j;

            /* 
             *   count the entries in this sublist by looking for the next
             *   entry whose starting word is different 
             */
            for (j = i ;
                 j < cnt && objlist[j].vocolfst == objlist[i].vocolfst ;
                 ++j)
            {
                /* 
                 *   for this entry, we need space for the object (1 + 2
                 *   for an object, or just 1 for nil) and flags (1 + 4) 
                 */
                if (objlist[j].vocolobj == MCMONINV)
                    lstsiz += 1;
                else
                    lstsiz += 3;
                lstsiz += 5;
            }

            /* 
             *   For this sublist, we need space for the first index (type
             *   prefix + number = 1 + 4 = 5) and the last index (5).
             *   We've already counted space for the objects in the list.
             *   Finally, we need space for the list type and length
             *   prefixes (1 + 2) for the sublist itself.  
             */
            lstsiz += (5 + 5) + 3;

            /* skip to the next element */
            i = j;
        }

        /* 
         *   finally, we need space for the first element of the list,
         *   which is the index of the next word to be parsed (1+4)
         */
        lstsiz += 5;

        /* allocate space for the list */
        lstp = voc_push_list_siz(ctx, lstsiz);

        /* 
         *   store the first element - the index of the next word to parse
         *   (adjusting to 1-based indexing) 
         */
        *lstp++ = DAT_NUMBER;
        oswp4s(lstp, next + 1);
        lstp += 4;

        /* build the list */
        for (i = 0 ; i < cnt ; )
        {
            uchar *sublstp;
            int j;
            int firstidx = -1;
            int lastidx = -1;

            /* store the list type prefix */
            *lstp++ = DAT_LIST;

            /* 
             *   remember where the length prefix is, then skip it - we'll
             *   come back and fill it in when we're done with the sublist 
             */
            sublstp = lstp;
            lstp += 2;

            /* search the array to find the indices of the boundary words */
            for (j = 0 ; j < wordcnt ; ++j)
            {
                /* if this is the first word, remember the index */
                if (wordarr[j] == objlist[i].vocolfst)
                    firstidx = j;

                /* if this is the last word, remember the index */
                if (wordarr[j] == objlist[i].vocollst)
                {
                    /* remember the index */
                    lastidx = j;

                    /* 
                     *   we can stop looking now, since the words are
                     *   always in order (so the first index will never be
                     *   after the last index) 
                     */
                    break;
                }
            }

            /* add the first and last index, adjusting to 1-based indexing */
            *lstp++ = DAT_NUMBER;
            oswp4s(lstp, firstidx + 1);
            lstp += 4;
            *lstp++ = DAT_NUMBER;
            oswp4s(lstp, lastidx + 1);
            lstp += 4;

            /* add the objects */
            for (j = i ; 
                 j < cnt && objlist[j].vocolfst == objlist[i].vocolfst ;
                 ++j)
            {
                /* add this object */
                if (objlist[j].vocolobj == MCMONINV)
                {
                    /* just store a nil */
                    *lstp++ = DAT_NIL;
                }
                else
                {
                    /* store the object */
                    *lstp++ = DAT_OBJECT;
                    oswp2(lstp, objlist[j].vocolobj);
                    lstp += 2;
                }

                /* add the flags */
                *lstp++ = DAT_NUMBER;
                oswp4s(lstp, objlist[i].vocolflg);
                lstp += 4;
            }

            /* fix up the sublist's length prefix */
            oswp2(sublstp, lstp - sublstp);

            /* move on to the next sublist */
            i = j;
        }
    }

    /* exit the stack frame */
    voc_leave(ctx, save_sp);
}